

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLookupResultValid
               (Texture2DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FilterMode FVar4;
  ConstPixelBufferAccess *pCVar5;
  ConstPixelBufferAccess *level1;
  float fVar6;
  int local_94;
  int level_1;
  int maxLevel_1;
  int minLevel_1;
  float local_80;
  float local_7c;
  float maxF;
  float minF;
  int level;
  int maxLevel;
  int minLevel;
  int maxTexLevel;
  int minTexLevel;
  bool isLinearMipmap;
  bool isNearestMipmap;
  int layer;
  bool canBeMinified;
  float fStack_54;
  bool canBeMagnified;
  float maxLod;
  float minLod;
  Vec2 coordXY;
  IVec2 layerRange;
  Vec4 *result_local;
  Vec2 *lodBounds_local;
  Vec3 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  Texture2DArrayView *texture_local;
  
  iVar2 = Texture2DArrayView::getNumLayers(texture);
  iVar3 = Vector<int,_3>::z(&prec->coordBits);
  fVar6 = Vector<float,_3>::z(coord);
  computeLayerRange((tcu *)&coordXY,iVar2,iVar3,fVar6);
  Vector<float,_3>::swizzle((Vector<float,_3> *)&maxLod,(int)coord,0);
  fStack_54 = Vector<float,_2>::x(lodBounds);
  layer = (int)Vector<float,_2>::y(lodBounds);
  isNearestMipmap = fStack_54 <= sampler->lodThreshold;
  isLinearMipmap = sampler->lodThreshold <= (float)layer && (float)layer != sampler->lodThreshold;
  minTexLevel = Vector<int,_2>::x((Vector<int,_2> *)&coordXY);
  do {
    iVar2 = minTexLevel;
    iVar3 = Vector<int,_2>::y((Vector<int,_2> *)&coordXY);
    if (iVar3 < iVar2) {
      return false;
    }
    if ((isNearestMipmap & 1U) != 0) {
      pCVar5 = Texture2DArrayView::getLevel(texture,0);
      bVar1 = isLevelSampleResultValid
                        (pCVar5,sampler,sampler->magFilter,prec,(Vec2 *)&maxLod,minTexLevel,result);
      if (bVar1) {
        return true;
      }
    }
    if ((isLinearMipmap & 1U) != 0) {
      maxTexLevel._3_1_ = TexVerifierUtil::isNearestMipmapFilter(sampler->minFilter);
      maxTexLevel._2_1_ = TexVerifierUtil::isLinearMipmapFilter(sampler->minFilter);
      minLevel = 0;
      iVar2 = Texture2DArrayView::getNumLevels(texture);
      maxLevel = iVar2 + -1;
      if (((maxTexLevel._2_1_ & 1) == 0) || (maxLevel < 1)) {
        if ((maxTexLevel._3_1_ & 1) == 0) {
          pCVar5 = Texture2DArrayView::getLevel(texture,0);
          bVar1 = isLevelSampleResultValid
                            (pCVar5,sampler,sampler->minFilter,prec,(Vec2 *)&maxLod,minTexLevel,
                             result);
          if (bVar1) {
            return true;
          }
        }
        else {
          fVar6 = ::deFloatCeil(fStack_54 + 0.5);
          local_94 = de::clamp<int>((int)fVar6 + -1,0,maxLevel);
          fVar6 = ::deFloatFloor((float)layer + 0.5);
          iVar2 = de::clamp<int>((int)fVar6,0,maxLevel);
          for (; local_94 <= iVar2; local_94 = local_94 + 1) {
            pCVar5 = Texture2DArrayView::getLevel(texture,local_94);
            FVar4 = TexVerifierUtil::getLevelFilter(sampler->minFilter);
            bVar1 = isLevelSampleResultValid
                              (pCVar5,sampler,FVar4,prec,(Vec2 *)&maxLod,minTexLevel,result);
            if (bVar1) {
              return true;
            }
          }
        }
      }
      else {
        fVar6 = ::deFloatFloor(fStack_54);
        level = de::clamp<int>((int)fVar6,0,maxLevel + -1);
        fVar6 = ::deFloatFloor((float)layer);
        minF = (float)de::clamp<int>((int)fVar6,0,maxLevel + -1);
        for (maxF = (float)level; (int)maxF <= (int)minF; maxF = (float)((int)maxF + 1)) {
          local_7c = de::clamp<float>(fStack_54 - (float)(int)maxF,0.0,1.0);
          local_80 = de::clamp<float>((float)layer - (float)(int)maxF,0.0,1.0);
          pCVar5 = Texture2DArrayView::getLevel(texture,(int)maxF);
          level1 = Texture2DArrayView::getLevel(texture,(int)maxF + 1);
          FVar4 = TexVerifierUtil::getLevelFilter(sampler->minFilter);
          iVar2 = minTexLevel;
          Vector<float,_2>::Vector((Vector<float,_2> *)&maxLevel_1,local_7c,local_80);
          bVar1 = isMipmapLinearSampleResultValid
                            (pCVar5,level1,sampler,FVar4,prec,(Vec2 *)&maxLod,iVar2,
                             (Vec2 *)&maxLevel_1,result);
          if (bVar1) {
            return true;
          }
        }
      }
    }
    minTexLevel = minTexLevel + 1;
  } while( true );
}

Assistant:

bool isLookupResultValid (const Texture2DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.z(), coord.z());
	const Vec2		coordXY			= coord.swizzle(0,1);
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordXY, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordXY, layer, result))
					return true;
			}
		}
	}

	return false;
}